

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Error __thiscall llvm::sys::fs::TempFile::discard(TempFile *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  error_category *__cat;
  size_t extraout_RDX;
  undefined1 *in_RSI;
  StringRef Filename;
  error_code EC_00;
  error_code EC_01;
  int local_a0;
  undefined1 local_80 [8];
  error_code EC;
  char *local_68;
  Twine local_60;
  int local_48;
  undefined4 uStack_44;
  undefined1 local_38 [8];
  error_code RemoveEC;
  TempFile *this_local;
  
  *in_RSI = 1;
  std::error_code::error_code((error_code *)local_38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Twine::Twine(&local_60,(string *)(in_RSI + 8));
    local_48 = remove((fs *)&local_60,(char *)0x1);
    local_38._4_4_ = uStack_44;
    local_38._0_4_ = local_48;
    EC._M_cat = (error_category *)std::__cxx11::string::data();
    std::__cxx11::string::length();
    Filename.Length = extraout_RDX;
    Filename.Data = local_68;
    DontRemoveFileOnSignal((sys *)EC._M_cat,Filename);
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_38);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)(in_RSI + 8),"");
  }
  if ((*(int *)(in_RSI + 0x28) != -1) && (iVar2 = close(*(int *)(in_RSI + 0x28)), iVar2 == -1)) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    __cat = (error_category *)std::_V2::generic_category();
    std::error_code::error_code((error_code *)local_80,iVar2,__cat);
    EC_00._M_cat._0_4_ = local_80._0_4_;
    EC_00._0_8_ = this;
    EC_00._M_cat._4_4_ = 0;
    errorCodeToError(EC_00);
    return (Error)(ErrorInfoBase *)this;
  }
  *(undefined4 *)(in_RSI + 0x28) = 0xffffffff;
  local_a0 = local_38._0_4_;
  EC_01._M_cat._0_4_ = local_a0;
  EC_01._0_8_ = this;
  EC_01._M_cat._4_4_ = 0;
  errorCodeToError(EC_01);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error TempFile::discard() {
  Done = true;
  std::error_code RemoveEC;
// On windows closing will remove the file.
#ifndef _WIN32
  // Always try to close and remove.
  if (!TmpName.empty()) {
    RemoveEC = fs::remove(TmpName);
    sys::DontRemoveFileOnSignal(TmpName);
  }
#endif

  if (!RemoveEC)
    TmpName = "";

  if (FD != -1 && close(FD) == -1) {
    std::error_code EC = std::error_code(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RemoveEC);
}